

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.h
# Opt level: O2

TextFile * __thiscall asl::TextFile::operator<<(TextFile *this,char *x)

{
  size_t in_RCX;
  void *__buf;
  String SStack_28;
  
  String::String(&SStack_28,*x);
  write(this,(int)&SStack_28,__buf,in_RCX);
  String::~String(&SStack_28);
  return this;
}

Assistant:

TextFile& operator<<(const T& x) { write(String(x)); return *this; }